

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetMaxNonlinIters(ARKodeMem ark_mem,int maxcor)

{
  int iVar1;
  int in_ESI;
  ARKodeMem in_RDI;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe0,
                       (ARKodeMRIStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (*(long *)(in_stack_ffffffffffffffe0 + 0x98) == 0) {
      arkProcessError(in_RDI,-0x20,0x1e6,"mriStep_SetMaxNonlinIters",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                      ,"No SUNNonlinearSolver object is present");
      local_4 = -0x16;
    }
    else {
      if (in_ESI < 1) {
        in_stack_ffffffffffffffe0[0x118] = '\x03';
        in_stack_ffffffffffffffe0[0x119] = '\0';
        in_stack_ffffffffffffffe0[0x11a] = '\0';
        in_stack_ffffffffffffffe0[0x11b] = '\0';
      }
      else {
        *(int *)(in_stack_ffffffffffffffe0 + 0x118) = in_ESI;
      }
      iVar1 = SUNNonlinSolSetMaxIters
                        (*(undefined8 *)(in_stack_ffffffffffffffe0 + 0x98),
                         *(undefined4 *)(in_stack_ffffffffffffffe0 + 0x118));
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        arkProcessError(in_RDI,-0x20,499,"mriStep_SetMaxNonlinIters",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                        ,"Error setting maxcor in SUNNonlinearSolver object");
        local_4 = -0x20;
      }
    }
  }
  return local_4;
}

Assistant:

int mriStep_SetMaxNonlinIters(ARKodeMem ark_mem, int maxcor)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return error message if no NLS module is present */
  if (step_mem->NLS == NULL)
  {
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    "No SUNNonlinearSolver object is present");
    return (ARK_ILL_INPUT);
  }

  /* argument <= 0 sets default, otherwise set input */
  if (maxcor <= 0) { step_mem->maxcor = MAXCOR; }
  else { step_mem->maxcor = maxcor; }

  /* send argument to NLS structure */
  retval = SUNNonlinSolSetMaxIters(step_mem->NLS, step_mem->maxcor);
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    "Error setting maxcor in SUNNonlinearSolver object");
    return (ARK_NLS_OP_ERR);
  }

  return (ARK_SUCCESS);
}